

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O2

int run_test_tcp_create_early_accept(void)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  uv_loop_t *loop;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b_4;
  int64_t eval_b_1;
  undefined8 local_228;
  uv_connect_t connect_req;
  uv_tcp_t client;
  uv_tcp_t server;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&client);
  pvVar3 = (void *)(long)iVar1;
  connect_req.data = (void *)0x0;
  server.data = pvVar3;
  if (pvVar3 != (void *)0x0) {
    pcVar6 = "0";
    pcVar5 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar2 = 0x40;
    lVar4 = 0;
    goto LAB_0018a585;
  }
  iVar1 = uv_tcp_init(uVar2,&server);
  connect_req.data = (void *)(long)iVar1;
  eval_b_1 = 0;
  if (connect_req.data == (void *)0x0) {
    iVar1 = uv_tcp_bind(&server,&client,0);
    connect_req.data = (void *)(long)iVar1;
    eval_b_1 = 0;
    if (connect_req.data != (void *)0x0) {
      uVar2 = 0x46;
      goto LAB_0018a4ff;
    }
    iVar1 = uv_listen(&server,0x80,on_connection);
    connect_req.data = (void *)(long)iVar1;
    eval_b_1 = 0;
    if (connect_req.data != (void *)0x0) {
      uVar2 = 0x49;
      goto LAB_0018a4ff;
    }
    uVar2 = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&eval_b_1);
    pvVar3 = (void *)(long)iVar1;
    connect_req.data = (void *)0x0;
    client.data = pvVar3;
    if (pvVar3 != (void *)0x0) {
      pcVar6 = "0";
      pcVar5 = "uv_ip4_addr(\"127.0.0.1\", 9123, &server_addr)";
      uVar2 = 0x51;
      lVar4 = 0;
      goto LAB_0018a585;
    }
    iVar1 = uv_tcp_init(uVar2,&client);
    connect_req.data = (void *)(long)iVar1;
    if (connect_req.data == (void *)0x0) {
      iVar1 = uv_tcp_connect(&connect_req,&client,&eval_b_1,on_connect);
      pvVar3 = (void *)(long)iVar1;
      local_228 = 0;
      if (pvVar3 == (void *)0x0) {
        uVar2 = uv_default_loop();
        uv_run(uVar2,0);
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        eval_b_1 = 0;
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        lVar4 = (long)iVar1;
        if (eval_b_1 == lVar4) {
          uv_library_shutdown();
          return 0;
        }
        pcVar6 = "uv_loop_close(uv_default_loop())";
        pcVar5 = "0";
        uVar2 = 0xd3;
        pvVar3 = (void *)eval_b_1;
      }
      else {
        pcVar6 = "0";
        pcVar5 = "r";
        uVar2 = 0x5a;
        lVar4 = 0;
      }
      goto LAB_0018a585;
    }
    uVar2 = 0x54;
  }
  else {
    uVar2 = 0x43;
LAB_0018a4ff:
    eval_b_1 = 0;
  }
  lVar4 = 0;
  pcVar6 = "0";
  pcVar5 = "r";
  pvVar3 = connect_req.data;
LAB_0018a585:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-create-socket-early.c"
          ,uVar2,pcVar5,"==",pcVar6,pvVar3,"==",lVar4);
  abort();
}

Assistant:

TEST_IMPL(tcp_create_early_accept) {
  uv_tcp_t client, server;
  uv_connect_t connect_req;

  tcp_listener(uv_default_loop(), &server);
  tcp_connector(uv_default_loop(), &client, &connect_req);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}